

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_>::FindKey
          (TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *this,
          PClassActor *key)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  Node *local_28;
  Node *n;
  PClassActor *pPStack_18;
  THashTraits<PClassActor_*> Traits;
  PClassActor *key_local;
  TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *this_local;
  
  pPStack_18 = key;
  local_28 = MainPosition(this,key);
  while( true ) {
    bVar3 = false;
    if (local_28 != (Node *)0x0) {
      bVar1 = Node::IsNil(local_28);
      bVar3 = false;
      if (!bVar1) {
        iVar2 = THashTraits<PClassActor_*>::Compare
                          ((THashTraits<PClassActor_*> *)((long)&n + 7),(local_28->Pair).Key,
                           pPStack_18);
        bVar3 = iVar2 != 0;
      }
    }
    if (!bVar3) break;
    local_28 = local_28->Next;
  }
  if ((local_28 != (Node *)0x0) && (bVar3 = Node::IsNil(local_28), !bVar3)) {
    return local_28;
  }
  return (Node *)0x0;
}

Assistant:

Node *FindKey(const KT key)
	{
		HashTraits Traits;
		Node *n = MainPosition(key);
		while (n != NULL && !n->IsNil() && Traits.Compare(n->Pair.Key, key))
		{
			n = n->Next;
		}
		return n == NULL || n->IsNil() ? NULL : n;
	}